

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

NextCommentStatus __thiscall
google::protobuf::io::Tokenizer::TryConsumeCommentStart(Tokenizer *this)

{
  int iVar1;
  bool bVar2;
  CommentStyle CVar3;
  
  CVar3 = this->comment_style_;
  if (CVar3 == CPP_COMMENT_STYLE) {
    bVar2 = TryConsume(this,'/');
    if (bVar2) {
      bVar2 = TryConsume(this,'/');
      if (bVar2) {
        return LINE_COMMENT;
      }
      bVar2 = TryConsume(this,'*');
      if (!bVar2) {
        (this->current_).type = TYPE_SYMBOL;
        std::__cxx11::string::assign((char *)&(this->current_).text);
        iVar1 = this->column_;
        (this->current_).line = this->line_;
        (this->current_).column = iVar1 + -1;
        (this->current_).end_column = iVar1;
        return SLASH_NOT_COMMENT;
      }
      return BLOCK_COMMENT;
    }
    CVar3 = this->comment_style_;
  }
  if ((CVar3 == SH_COMMENT_STYLE) && (bVar2 = TryConsume(this,'#'), bVar2)) {
    return LINE_COMMENT;
  }
  return NO_COMMENT;
}

Assistant:

Tokenizer::NextCommentStatus Tokenizer::TryConsumeCommentStart() {
  if (comment_style_ == CPP_COMMENT_STYLE && TryConsume('/')) {
    if (TryConsume('/')) {
      return LINE_COMMENT;
    } else if (TryConsume('*')) {
      return BLOCK_COMMENT;
    } else {
      // Oops, it was just a slash.  Return it.
      current_.type = TYPE_SYMBOL;
      current_.text = "/";
      current_.line = line_;
      current_.column = column_ - 1;
      current_.end_column = column_;
      return SLASH_NOT_COMMENT;
    }
  } else if (comment_style_ == SH_COMMENT_STYLE && TryConsume('#')) {
    return LINE_COMMENT;
  } else {
    return NO_COMMENT;
  }
}